

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O3

void duckdb::Leaf::InsertIntoInlined
               (ART *art,Node *node,ARTKey *row_id,idx_t depth,GateStatus status)

{
  uint8_t byte;
  idx_t node_00;
  Allocator *allocator_00;
  ulong *data;
  IndexPointer child;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  IndexPointer child_00;
  reference<Node> next;
  ArenaAllocator allocator;
  ARTKey local_88;
  ArenaAllocator local_78;
  
  allocator_00 = Allocator::Get((art->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&local_78,allocator_00,0x800);
  uVar1 = (node->super_IndexPointer).data;
  data = (ulong *)ArenaAllocator::Allocate(&local_78,8);
  *data = (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
          (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  *(data_t *)data = 0x80;
  ARTKey::ARTKey(&local_88,(data_ptr_t)data,8);
  uVar1 = (node->super_IndexPointer).data;
  if ((long)uVar1 < 0) {
    depth = 0;
  }
  if (status == GATE_NOT_SET) {
    depth = 0;
  }
  (node->super_IndexPointer).data = 0;
  uVar3 = depth;
  uVar2 = 0xffffffffffffffff;
  if (depth < local_88.len) {
    do {
      uVar2 = uVar3;
      if (row_id->data[uVar3] != *(data_t *)((long)local_88.data + uVar3)) break;
      uVar3 = uVar3 + 1;
      uVar2 = 0xffffffffffffffff;
    } while (local_88.len != uVar3);
  }
  byte = row_id->data[uVar2];
  local_88.len = (idx_t)node;
  if (uVar2 - depth != 0) {
    Prefix::New(art,(reference<Node> *)&local_88,row_id,depth,uVar2 - depth);
  }
  node_00 = local_88.len;
  if (uVar2 == 7) {
    BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::New(art,(Node *)local_88.len);
    uVar3 = *(ulong *)row_id->data & 0xfffffffffffffff8 ^ 0x87;
    child_00.data =
         *(ulong *)row_id->data >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
         (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8
         | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar2 = 7;
    child.data = 0;
  }
  else {
    BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(art,(Node *)local_88.len);
    uVar3 = *(ulong *)row_id->data & 0xfffffffffffffff8 ^ 0x87;
    child_00.data =
         *(ulong *)row_id->data >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
         (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8
         | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar3 = *(ulong *)local_88.data & 0xfffffffffffffff8 ^ 0x87;
    child.data = *(ulong *)local_88.data >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                 (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                 (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                 uVar3 << 0x38;
  }
  Node::InsertChild(art,(Node *)node_00,*(uint8_t *)((long)local_88.data + uVar2),(Node)child.data);
  Node::InsertChild(art,(Node *)node_00,byte,(Node)child_00.data);
  uVar1 = uVar1 & 0x8000000000000000;
  if (status == GATE_NOT_SET) {
    uVar1 = 0x8000000000000000;
  }
  (node->super_IndexPointer).data = (node->super_IndexPointer).data & 0x7fffffffffffffff | uVar1;
  ArenaAllocator::~ArenaAllocator(&local_78);
  return;
}

Assistant:

void Leaf::InsertIntoInlined(ART &art, Node &node, const ARTKey &row_id, idx_t depth, const GateStatus status) {
	D_ASSERT(node.GetType() == INLINED);

	ArenaAllocator allocator(Allocator::Get(art.db));
	auto key = ARTKey::CreateARTKey<row_t>(allocator, node.GetRowId());

	GateStatus new_status;
	if (status == GateStatus::GATE_NOT_SET || node.GetGateStatus() == GateStatus::GATE_SET) {
		new_status = GateStatus::GATE_SET;
	} else {
		new_status = GateStatus::GATE_NOT_SET;
	}

	if (new_status == GateStatus::GATE_SET) {
		depth = 0;
	}
	node.Clear();

	// Get the mismatching position.
	D_ASSERT(row_id.len == key.len);
	auto pos = row_id.GetMismatchPos(key, depth);
	D_ASSERT(pos != DConstants::INVALID_INDEX);
	D_ASSERT(pos >= depth);
	auto byte = row_id.data[pos];

	// Create the (optional) prefix and the node.
	reference<Node> next(node);
	auto count = pos - depth;
	if (count != 0) {
		Prefix::New(art, next, row_id, depth, count);
	}
	if (pos == Prefix::ROW_ID_COUNT) {
		Node7Leaf::New(art, next);
	} else {
		Node4::New(art, next);
	}

	// Create the children.
	Node row_id_node;
	Leaf::New(row_id_node, row_id.GetRowId());
	Node remainder;
	if (pos != Prefix::ROW_ID_COUNT) {
		Leaf::New(remainder, key.GetRowId());
	}

	Node::InsertChild(art, next, key[pos], remainder);
	Node::InsertChild(art, next, byte, row_id_node);
	node.SetGateStatus(new_status);
}